

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_AzureStoragePutBlock
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle,
          uint32_t blockNumber,uint8_t *dataPtr,size_t dataSize)

{
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  
  if ((dataPtr == (uint8_t *)0x0 ||
      azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) ||
      dataSize == 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_AzureStoragePutBlock",0xbd4,1,
                "invalid parameters azureStorageClientHandle=%p, dataPtr=%p, dataSize=%zu",
                azureStorageClientHandle,dataPtr,dataSize);
    }
    return IOTHUB_CLIENT_INVALID_ARG;
  }
  IVar1 = IoTHubClient_LL_UploadToBlob_PutBlock
                    (azureStorageClientHandle,blockNumber,dataPtr,dataSize);
  return IVar1;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_AzureStoragePutBlock(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle, uint32_t blockNumber, const uint8_t* dataPtr, size_t dataSize)
{
    IOTHUB_CLIENT_RESULT result;

    if (
        (azureStorageClientHandle == NULL) ||
        (dataPtr == NULL) ||
        (dataSize == 0)
        )
    {
        LogError("invalid parameters azureStorageClientHandle=%p, dataPtr=%p, dataSize=%zu", azureStorageClientHandle, dataPtr, dataSize);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        result = IoTHubClient_LL_UploadToBlob_PutBlock(azureStorageClientHandle, blockNumber, dataPtr, dataSize);
    }

    return result;
}